

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O3

Ref<embree::XML> __thiscall embree::XML::childOpt(XML *this,string *childID)

{
  pointer pcVar1;
  void *__s2;
  _func_int *__n;
  _func_int **pp_Var2;
  int iVar3;
  undefined8 *in_RDX;
  long lVar4;
  long lVar5;
  
  pcVar1 = childID[4]._M_dataplus._M_p;
  lVar5 = childID[4]._M_string_length - (long)pcVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    __s2 = (void *)*in_RDX;
    __n = (_func_int *)in_RDX[1];
    lVar4 = 0;
    do {
      pp_Var2 = *(_func_int ***)(pcVar1 + lVar4 * 8);
      if ((pp_Var2[7] == __n) &&
         ((__n == (_func_int *)0x0 || (iVar3 = bcmp(pp_Var2[6],__s2,(size_t)__n), iVar3 == 0)))) {
        (this->super_RefCount)._vptr_RefCount = pp_Var2;
        (**(code **)(*pp_Var2 + 0x10))(pp_Var2);
        return (Ref<embree::XML>)this;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
  }
  (this->super_RefCount)._vptr_RefCount = (_func_int **)0x0;
  return (Ref<embree::XML>)this;
}

Assistant:

const Ref<XML> childOpt(const std::string& childID) const 
    {
      for (size_t i=0; i<children.size(); i++)
        if (children[i]->name == childID) return children[i];
      return null;
    }